

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawColumnRt1CopyPalCommand::Execute
          (DrawColumnRt1CopyPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint8_t *puVar8;
  ulong uVar9;
  
  iVar5 = (this->super_PalRtCommand).yl;
  uVar2 = ((this->super_PalRtCommand).yh - iVar5) + 1;
  uVar7 = thread->pass_end_y - iVar5;
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  if ((int)uVar2 < (int)uVar7) {
    uVar7 = uVar2;
  }
  uVar2 = thread->pass_start_y - iVar5;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  iVar1 = thread->num_cores;
  iVar4 = (iVar1 - (int)((iVar5 + uVar2) - thread->core) % iVar1) % iVar1;
  uVar9 = (long)(int)((~uVar2 + iVar1 + uVar7) - iVar4) / (long)iVar1;
  if (0 < (int)uVar9) {
    iVar4 = iVar5 + uVar2 + iVar4;
    puVar8 = (this->super_PalRtCommand)._destorg +
             (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar4];
    puVar3 = thread->dc_temp +
             (long)*(int *)&(this->super_PalRtCommand).super_DrawerCommand.field_0xc +
             (long)(iVar4 / iVar1) * 4;
    lVar6 = (long)(this->super_PalRtCommand)._pitch * (long)iVar1;
    if ((uVar9 & 1) != 0) {
      *puVar8 = *puVar3;
      puVar3 = puVar3 + 4;
      puVar8 = puVar8 + lVar6;
    }
    iVar5 = (int)lVar6;
    if ((uVar9 & 2) != 0) {
      *puVar8 = *puVar3;
      puVar8[lVar6] = puVar3[4];
      puVar3 = puVar3 + 8;
      puVar8 = puVar8 + iVar5 * 2;
    }
    if (3 < (int)uVar9) {
      uVar9 = (uVar9 & 0xffffffff) >> 2;
      do {
        *puVar8 = *puVar3;
        puVar8[lVar6] = puVar3[4];
        puVar8[(long)iVar5 * 2] = puVar3[8];
        puVar8[(long)iVar5 * 3] = puVar3[0xc];
        puVar3 = puVar3 + 0x10;
        puVar8 = puVar8 + iVar5 * 4;
        uVar7 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar7;
      } while (uVar7 != 0);
    }
  }
  return;
}

Assistant:

void DrawColumnRt1CopyPalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *source;
		uint8_t *dest;
		int count;
		int pitch;

		count = yh - yl + 1;

		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4 + hx];
		pitch = _pitch * thread->num_cores;

		if (count & 1) {
			*dest = *source;
			source += 4;
			dest += pitch;
		}
		if (count & 2) {
			dest[0] = source[0];
			dest[pitch] = source[4];
			source += 8;
			dest += pitch*2;
		}
		if (!(count >>= 2))
			return;

		do {
			dest[0] = source[0];
			dest[pitch] = source[4];
			dest[pitch*2] = source[8];
			dest[pitch*3] = source[12];
			source += 16;
			dest += pitch*4;
		} while (--count);
	}